

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O1

SiameseResult __thiscall
siamese::EncoderPacketWindow::Add(EncoderPacketWindow *this,SiameseOriginalPacket *packet)

{
  ostringstream *poVar1;
  uint column;
  undefined1 auVar2 [16];
  bool bVar3;
  uint uVar4;
  EncoderSubwindow *__s;
  long lVar5;
  uint64_t uVar6;
  OutputWorker *pOVar7;
  OriginalPacket *this_00;
  uint uVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 local_1b8 [392];
  
  if (this->EmergencyDisabled != false) {
    return Siamese_Disabled;
  }
  uVar8 = this->Count;
  if (uVar8 == 16000) {
    return Siamese_MaxPacketsReached;
  }
  column = this->NextColumn;
  uVar4 = (this->Subwindows).Size;
  packet->PacketNum = column;
  if (uVar8 + 8 < uVar4 << 6) {
LAB_0016c707:
    if (this->Count == 0) {
      uVar8 = column & 7;
      StartNewWindow(this,column);
    }
    else {
      this->Count = this->Count + 1;
    }
    this_00 = (OriginalPacket *)
              ((long)&((this->Subwindows).DataPtr[uVar8 >> 6]->Originals)._M_elems[0].Buffer.Data +
              (ulong)((uVar8 & 0x3f) * 0x18));
    uVar4 = OriginalPacket::Initialize(this_00,this->TheAllocator,packet);
    if (uVar4 != 0) {
      uVar6 = GetTimeMsec();
      ((this->Subwindows).DataPtr[uVar8 >> 6]->LastSendMsec)._M_elems[uVar8 & 0x3f] = (uint)uVar6;
      this->NextColumn = this->NextColumn + 1 & 0x3fffff;
      uVar8 = (this_00->Buffer).Bytes;
      if (this->Lanes[column & 7].LongestPacket < uVar8) {
        this->Lanes[column & 7].LongestPacket = uVar8;
      }
      if (this->LongestPacket < uVar8) {
        this->LongestPacket = uVar8;
      }
      auVar2 = vpmovsxbq_avx(ZEXT216(0x101));
      auVar2 = vpinsrq_avx(auVar2,(ulong)packet->DataBytes,1);
      auVar2 = vpaddq_avx(auVar2,*(undefined1 (*) [16])this->Stats->Counts);
      *(undefined1 (*) [16])this->Stats->Counts = auVar2;
      return Siamese_Success;
    }
    this->EmergencyDisabled = true;
    if (4 < DAT_0020d7e8) {
      return Siamese_Disabled;
    }
    poVar1 = (ostringstream *)(local_1b8 + 0x10);
    local_1b8._0_8_ = Logger;
    local_1b8._8_4_ = Error;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,DAT_0020d818,DAT_0020d820);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"WindowAdd.Initialize OOM",0x18);
    pOVar7 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar7,(LogStringBuffer *)local_1b8);
  }
  else {
    __s = (EncoderSubwindow *)pktalloc::Allocator::Allocate(this->TheAllocator,0x700);
    if (__s == (EncoderSubwindow *)0x0) {
      __s = (EncoderSubwindow *)0x0;
    }
    else {
      memset(__s,0,0x700);
      auVar9 = vpmovzxbq_avx512f(ZEXT816(0xa890786048301800));
      lVar5 = 0x40;
      auVar10 = vpbroadcastq_avx512f();
      auVar11 = vpbroadcastq_avx512f(ZEXT816(0xc0));
      do {
        auVar12 = vpaddq_avx512f(auVar10,auVar9);
        vpscatterqq_avx512f(ZEXT864(__s) + auVar9,0xffff,ZEXT1664((undefined1  [16])0x0));
        auVar14 = auVar12._0_32_;
        auVar13 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        vpscatterqd_avx512f(ZEXT832(8) + auVar14,0xffff,auVar13);
        vpscatterqd_avx512f(ZEXT832(0x10) + auVar14,0xffff,auVar13);
        vpscatterqd_avx512f(ZEXT832(0x14) + auVar14,0xffff,auVar13);
        auVar9 = vpaddq_avx512f(auVar9,auVar11);
        lVar5 = lVar5 + -8;
      } while (lVar5 != 0);
    }
    if (__s != (EncoderSubwindow *)0x0) {
      uVar4 = (this->Subwindows).Size;
      bVar3 = pktalloc::LightVector<siamese::EncoderSubwindow_*,_25U>::SetSize_Copy
                        (&this->Subwindows,uVar4 + 1);
      if (bVar3) {
        (this->Subwindows).DataPtr[uVar4] = __s;
        goto LAB_0016c707;
      }
    }
    this->EmergencyDisabled = true;
    if (4 < DAT_0020d7e8) {
      return Siamese_Disabled;
    }
    poVar1 = (ostringstream *)(local_1b8 + 0x10);
    local_1b8._0_8_ = Logger;
    local_1b8._8_4_ = Error;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,DAT_0020d818,DAT_0020d820);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"WindowAdd.Construct OOM",0x17);
    pOVar7 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar7,(LogStringBuffer *)local_1b8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 0x10));
  std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  return Siamese_Disabled;
}

Assistant:

SiameseResult EncoderPacketWindow::Add(SiameseOriginalPacket& packet)
{
    if (EmergencyDisabled) {
        return Siamese_Disabled;
    }

    if (GetRemainingSlots() <= 0) {
        // This is not invalid input - The application often does not have
        // control over how much data it tries to send.  Instead it must
        // listen for our feedback return code to decide when to slow down.
        return Siamese_MaxPacketsReached;
    }

    const unsigned column         = NextColumn;
    const unsigned subwindowCount = Subwindows.GetSize();
    unsigned element              = Count;

    // Assign packet number
    packet.PacketNum = column;

    // If there is not enough room for this new element:
    // Note: Adding a buffer of kColumnLaneCount to create space ahead for
    // snapshots as a subwindow is filled and we need to store its snapshot
    if (element + kColumnLaneCount >= subwindowCount * kSubwindowSize)
    {
        EncoderSubwindow* subwindow = TheAllocator->Construct<EncoderSubwindow>();
        if (!subwindow || !Subwindows.Append(subwindow))
        {
            EmergencyDisabled = true;
            Logger.Error("WindowAdd.Construct OOM");
            SIAMESE_DEBUG_BREAK();
            return Siamese_Disabled;
        }
    }

    if (Count > 0) {
        ++Count;
    }
    else
    {
        // Start a new window:
        element = column % kColumnLaneCount;
        StartNewWindow(column);
    }

    // Initialize original packet with received data
    OriginalPacket* original = GetWindowElement(element);
    if (0 == original->Initialize(TheAllocator, packet))
    {
        EmergencyDisabled = true;
        Logger.Error("WindowAdd.Initialize OOM");
        SIAMESE_DEBUG_BREAK();
        return Siamese_Disabled;
    }
    SIAMESE_DEBUG_ASSERT(original->Column % kColumnLaneCount == element % kColumnLaneCount);

    // Attach original send time in milliseconds
    *GetWindowElementTimestampPtr(element) = static_cast<uint32_t>(GetTimeMsec());

    // Roll next column to assign
    NextColumn = IncrementColumn1(NextColumn);

    // Update longest packet
    const unsigned originalBytes = original->Buffer.Bytes;
    const unsigned laneIndex     = column % kColumnLaneCount;
    EncoderColumnLane& lane      = Lanes[laneIndex];
    if (lane.LongestPacket < originalBytes) {
        lane.LongestPacket = originalBytes;
    }
    if (LongestPacket < originalBytes) {
        LongestPacket = originalBytes;
    }

    Stats->Counts[SiameseEncoderStats_OriginalCount]++;
    Stats->Counts[SiameseEncoderStats_OriginalBytes] += packet.DataBytes;
    return Siamese_Success;
}